

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_strispn(char *s,char *n)

{
  int iVar1;
  char cVar2;
  char cVar3;
  __int32_t *p_Var4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char cVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  
  cVar7 = *s;
  pcVar9 = s;
  if (cVar7 != '\0') {
    cVar2 = *n;
    pcVar8 = s;
    while (pcVar9 = s, cVar2 != '\0') {
      pp_Var5 = __ctype_tolower_loc();
      p_Var4 = *pp_Var5;
      iVar1 = p_Var4[cVar2];
      bVar10 = (long)cVar2 == 0;
      pcVar6 = n + 1;
      while (pcVar9 = pcVar8, p_Var4[cVar7] != iVar1) {
        cVar3 = *pcVar6;
        bVar10 = (long)cVar3 == 0;
        if (bVar10) goto LAB_001053cc;
        pcVar6 = pcVar6 + 1;
        iVar1 = p_Var4[cVar3];
      }
      if (bVar10) break;
      cVar7 = pcVar8[1];
      pcVar8 = pcVar8 + 1;
      pcVar9 = pcVar8;
      if (cVar7 == '\0') break;
    }
  }
LAB_001053cc:
  return (long)pcVar9 - (long)s;
}

Assistant:

size_t coda_strispn(const char *s, const char *n)
{
	const char *p = s;
	const char *x;

	for (; *p; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}